

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.cpp
# Opt level: O0

void __thiscall Link::Link(Link *this,char *name)

{
  char *in_RSI;
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffffb8;
  Entity *in_stack_ffffffffffffffc0;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,in_RSI,&local_31);
  MetaSim::Entity::Entity(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  *in_RDI = &PTR__Link_00174530;
  return;
}

Assistant:

Link::Link(const char *name) : Entity(name)
{
}